

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O3

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::scheduler_operation>::~op_queue
          (op_queue<boost::asio::detail::scheduler_operation> *this)

{
  scheduler_operation *psVar1;
  func_type p_Var2;
  scheduler_operation *tmp;
  scheduler_operation *psVar3;
  error_code local_30;
  
  psVar3 = this->front_;
  if (psVar3 != (scheduler_operation *)0x0) {
    do {
      psVar1 = psVar3->next_;
      this->front_ = psVar1;
      if (psVar1 == (scheduler_operation *)0x0) {
        this->back_ = (scheduler_operation *)0x0;
      }
      psVar3->next_ = (scheduler_operation *)0x0;
      p_Var2 = psVar3->func_;
      local_30.m_val = 0;
      local_30.m_cat = system::system_category();
      (*p_Var2)((void *)0x0,psVar3,&local_30,0);
      psVar3 = this->front_;
    } while (psVar3 != (scheduler_operation *)0x0);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }